

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ClosestPointData * __thiscall
CMeshClosestPointMapper::SamplePoint::ClosestPoint(SamplePoint *this,int fi)

{
  pointer *ppCVar1;
  ClosestPointData *pCVar2;
  ClosestPointData *pCVar3;
  iterator __position;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ClosestPointData *pCVar8;
  bool bVar9;
  
  if ((ulong)((long)(this->m_closestMeshPts).
                    super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(this->m_closestMeshPts).
                   super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x780) {
    std::
    vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ::reserve(&this->m_closestMeshPts,0x1e);
  }
  pCVar8 = (this->m_closestMeshPts).
           super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_closestMeshPts).
       super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = (long)__position._M_current - (long)pCVar8 != 0;
  if (bVar9) {
    uVar6 = (long)__position._M_current - (long)pCVar8 >> 6;
    if (pCVar8->m_fi != fi) {
      uVar5 = 1;
      do {
        uVar7 = uVar5;
        if (uVar6 + (uVar6 == 0) == uVar7) {
          bVar9 = uVar7 < uVar6;
          goto LAB_004ed0d8;
        }
        pCVar2 = pCVar8 + 1;
        pCVar3 = pCVar8 + 1;
        uVar5 = uVar7 + 1;
        pCVar8 = pCVar2;
      } while (pCVar3->m_fi != fi);
      bVar9 = uVar7 < uVar6;
    }
  }
LAB_004ed0d8:
  if (!bVar9) {
    if (__position._M_current ==
        (this->m_closestMeshPts).
        super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
      ::_M_realloc_insert<>(&this->m_closestMeshPts,__position);
    }
    else {
      ((__position._M_current)->m_P).y = 0.0;
      ((__position._M_current)->m_P).z = 0.0;
      (__position._M_current)->m_t[3] = 0.0;
      ((__position._M_current)->m_P).x = 0.0;
      (__position._M_current)->m_t[1] = 0.0;
      (__position._M_current)->m_t[2] = 0.0;
      *(undefined8 *)__position._M_current = 0;
      (__position._M_current)->m_t[0] = 0.0;
      ppCVar1 = &(this->m_closestMeshPts).
                 super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    pCVar4 = (this->m_closestMeshPts).
             super__Vector_base<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar8 = pCVar4 + -1;
    ClosestPtToMeshFace(this->m_mesh,fi,&this->m_pt,&pCVar4[-1].m_P,&pCVar4[-1].m_t);
    pCVar4[-1].m_fi = fi;
  }
  return pCVar8;
}

Assistant:

const ClosestPointData& ClosestPoint(int fi)
    {
      if (m_closestMeshPts.capacity() < 30)
      {
        m_closestMeshPts.reserve(30);
      }
      for (int i = 0; i < m_closestMeshPts.size(); i++)
      {
        if (m_closestMeshPts[i].m_fi == fi)
        {
          return m_closestMeshPts[i];
        }
      }
      m_closestMeshPts.emplace_back();
      ClosestPointData& q = m_closestMeshPts.back();
      ::ClosestPtToMeshFace(&m_mesh, fi, m_pt, q.m_P, q.m_t);
      q.m_fi = fi;
      return q;
    }